

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting_settings.cpp
# Opt level: O1

bool get_fitting_settings_from_command_line(fitting_settings *output,int argc,char **argv)

{
  long *plVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  int *piVar5;
  logic_error *plVar6;
  undefined8 uVar7;
  string *this;
  string *psVar8;
  ulong uVar9;
  float fVar10;
  string argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  stringstream ss;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  string *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined4 local_1b8;
  uint uStack_1b4;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  ios_base local_138 [264];
  
  local_1b8 = 0;
  local_198 = 0;
  local_190 = 0;
  local_178 = 0;
  local_170 = 0;
  local_158 = 0;
  local_150 = 0;
  output->num_error_estimate_samples = (undefined4)local_1a8;
  output->num_threads = local_1a8._4_4_;
  output->run_mode = (int)((ulong)uStack_1b4 << 0x20);
  output->resolution = (int)(((ulong)uStack_1b4 << 0x20) >> 0x20);
  output->min_roughness = (float)(undefined4)uStack_1b0;
  output->max_roughness = (float)uStack_1b0._4_4_;
  this = &output->brdf_method;
  local_1a0 = &local_190;
  local_180 = &local_170;
  local_160 = &local_150;
  std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
  local_200 = (string *)&output->output_file;
  std::__cxx11::string::operator=(local_200,(string *)&local_180);
  std::__cxx11::string::operator=((string *)&output->input_file,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(output->brdf_method)._M_string_length,0x19f048);
  output->resolution = 0x40;
  output->min_roughness = 0.0001;
  output->max_roughness = 1.0;
  output->num_error_estimate_samples = 0x20;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"result_",7);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_1a8,output->resolution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,output->resolution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".ltc",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=(local_200,(string *)&local_228);
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (1 < argc) {
    uVar9 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,argv[uVar9],(allocator<char> *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"arg: ",5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_228,local_220);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_228);
      iVar2 = std::__cxx11::string::compare((char *)local_1d8);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unrecognized argument \"",0x17);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_228,local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\". Aborting.",0xc);
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"Unrecognized argument.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      lVar4 = std::__cxx11::string::find((char)(string *)&local_228,0x3d);
      if (lVar4 == -1) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"Argument assignment has assignment operator.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_228);
      std::__cxx11::string::substr((ulong)local_1f8,(ulong)&local_228);
      iVar2 = std::__cxx11::string::compare((char *)local_1d8);
      psVar8 = (string *)this;
      if (iVar2 == 0) {
LAB_0017aa0d:
        std::__cxx11::string::_M_assign(psVar8);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_1d8);
        plVar1 = local_1f8[0];
        if (iVar2 == 0) {
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          *piVar5 = 0;
          lVar4 = strtol((char *)plVar1,(char **)&local_208,10);
          if (local_208 != plVar1) {
            if (((int)lVar4 == lVar4) && (*piVar5 != 0x22)) {
              if (*piVar5 == 0) {
                *piVar5 = iVar2;
              }
              output->resolution = (int)lVar4;
              goto LAB_0017aaca;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
LAB_0017ac27:
          std::__throw_invalid_argument("stof");
LAB_0017ac33:
          uVar7 = std::__throw_out_of_range("stof");
          __cxa_free_exception(piVar5);
          if (local_228 != local_218) {
            operator_delete(local_228,local_218[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
          std::ios_base::~ios_base(local_138);
          _Unwind_Resume(uVar7);
        }
        iVar2 = std::__cxx11::string::compare((char *)local_1d8);
        plVar1 = local_1f8[0];
        if (iVar2 == 0) {
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          *piVar5 = 0;
          fVar10 = strtof((char *)plVar1,(char **)&local_208);
          if (local_208 == plVar1) goto LAB_0017ac27;
          if (*piVar5 == 0) {
            *piVar5 = iVar2;
          }
          else if (*piVar5 == 0x22) goto LAB_0017ac33;
          output->min_roughness = fVar10;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_1d8);
          psVar8 = local_200;
          if (iVar2 == 0) goto LAB_0017aa0d;
        }
      }
LAB_0017aaca:
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      uVar9 = uVar9 + 1;
    } while ((uint)argc != uVar9);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return true;
}

Assistant:

bool get_fitting_settings_from_command_line(
  fitting_settings &output,
  int argc,
  const char *argv[]
)
{
  output = fitting_settings();

  output.brdf_method = "ggx";
  output.resolution = 64;
  output.min_roughness = 0.0001f;
  output.max_roughness = 1.0f;
  output.num_error_estimate_samples = 32;

  std::stringstream ss;
  ss << "result_" << output.resolution << "x" << output.resolution << ".ltc";
  output.output_file = ss.str();

  for (auto argId = 1; argId < argc; ++argId) {
    std::string argument = argv[argId];
    std::cout << "arg: " << argument << std::endl;
    if (argument.substr(0, 2) != "--") {
      std::cerr << "Unrecognized argument \"" << argument << "\". Aborting.";
      throw std::logic_error("Unrecognized argument.");
    }

    auto assignmentOperator = argument.find_first_of('=');
    if (assignmentOperator == -1) {
      throw std::logic_error("Argument assignment has assignment operator.");
    }

    auto key = argument.substr(2, assignmentOperator - 2);
    auto value = argument.substr(assignmentOperator + 1, argument.length() - assignmentOperator - 1);

    if (key == "brdf") {
      output.brdf_method = value;
    }
    else if (key == "resolution") {
      output.resolution = std::stoi(value);
    }
    else if (key == "min-roughness") {
      output.min_roughness = std::stof(value);
    }
    else if (key == "output") {
      output.output_file = value;
    }
  }

  return true;
}